

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

Udata * luaS_newudata(lua_State *L,size_t s)

{
  Udata *iu;
  Udata *pUVar1;
  
  if (s < 0x7fffffffffffffd8) {
    pUVar1 = (Udata *)luaC_newobj(L,7,s + 0x28);
    pUVar1->len = s;
    pUVar1->metatable = (Table *)0x0;
    pUVar1->user_ = (Value)0x0;
    pUVar1->ttuv_ = '\0';
    return pUVar1;
  }
  luaM_toobig(L);
}

Assistant:

Udata *luaS_newudata(lua_State *L, size_t s) {
    Udata *u;
    GCObject *o;
    if (s > MAX_SIZE - sizeof(Udata))
        luaM_toobig(L);
    o = luaC_newobj(L, LUA_TUSERDATA, sizeludata(s));
    u = gco2u(o);
    u->len = s;
    u->metatable = NULL;
    setuservalue(L, u, luaO_nilobject);
    return u;
}